

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool ts_parser__can_reuse_first_leaf
                (TSParser *self,TSStateId state,Subtree tree,TableEntry *table_entry)

{
  TSLexMode TVar1;
  TSLexMode *pTVar2;
  undefined1 uVar3;
  uint uVar4;
  undefined2 in_register_00000032;
  TSSymbol TVar5;
  uint16_t uVar6;
  TSStateId TVar7;
  
  pTVar2 = self->language->lex_modes;
  if (((ulong)tree.ptr & 1) == 0) {
    if ((tree.ptr)->child_count == 0) {
      TVar5 = (tree.ptr)->symbol;
    }
    else {
      TVar5 = ((tree.ptr)->field_17).field_0.first_leaf.symbol;
    }
  }
  else {
    TVar5 = (TSSymbol)tree.data.symbol;
  }
  TVar1 = pTVar2[CONCAT22(in_register_00000032,state)];
  uVar6 = tree.data.parse_state;
  TVar7 = uVar6;
  if (((ulong)tree.ptr & 1) == 0) {
    if ((tree.ptr)->child_count == 0) {
      TVar7 = (tree.ptr)->parse_state;
    }
    else {
      TVar7 = ((tree.ptr)->field_17).field_0.first_leaf.parse_state;
    }
  }
  if (pTVar2[TVar7] == TVar1) {
    if (TVar5 != self->language->keyword_capture_token) {
      return true;
    }
    if (((ulong)tree.ptr & 1) == 0) {
      uVar4 = *(uint *)&(tree.ptr)->field_0x2c >> 8;
    }
    else {
      uVar4 = (uint)((ulong)tree.ptr >> 6) & 0x3ffffff;
    }
    if ((uVar4 & 1) == 0) {
      if (((ulong)tree.ptr & 1) == 0) {
        uVar6 = (tree.ptr)->parse_state;
      }
      if (uVar6 == state) {
        return true;
      }
    }
  }
  if (((ulong)tree.ptr & 1) == 0) {
    uVar4 = ((tree.ptr)->size).bytes;
  }
  else {
    uVar4 = tree._0_4_ >> 0x18;
  }
  uVar3 = 0;
  if ((TVar5 == 0 || uVar4 != 0) && (uVar3 = 0, (uint)TVar1 < 0x10000)) {
    uVar3 = table_entry->is_reusable;
  }
  return (_Bool)uVar3;
}

Assistant:

static bool ts_parser__can_reuse_first_leaf(TSParser *self, TSStateId state, Subtree tree,
                                            TableEntry *table_entry) {
  TSLexMode current_lex_mode = self->language->lex_modes[state];
  TSSymbol leaf_symbol = ts_subtree_leaf_symbol(tree);
  TSStateId leaf_state = ts_subtree_leaf_parse_state(tree);
  TSLexMode leaf_lex_mode = self->language->lex_modes[leaf_state];

  // If the token was created in a state with the same set of lookaheads, it is reusable.
  if (memcmp(&leaf_lex_mode, &current_lex_mode, sizeof(TSLexMode)) == 0 &&
      (leaf_symbol != self->language->keyword_capture_token ||
       (!ts_subtree_is_keyword(tree) && ts_subtree_parse_state(tree) == state))) return true;

  // Empty tokens are not reusable in states with different lookaheads.
  if (ts_subtree_size(tree).bytes == 0 && leaf_symbol != ts_builtin_sym_end) return false;

  // If the current state allows external tokens or other tokens that conflict with this
  // token, this token is not reusable.
  return current_lex_mode.external_lex_state == 0 && table_entry->is_reusable;
}